

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

int r4k_map_address_mips64el
              (CPUMIPSState_conflict5 *env,hwaddr *physical,int *prot,target_ulong address,int rw,
              int access_type)

{
  ushort uVar1;
  uint uVar2;
  ulong *puVar3;
  ulong uVar4;
  bool bVar5;
  uint local_7c;
  uint local_78;
  int n;
  target_ulong VPN;
  target_ulong tag;
  target_ulong mask;
  r4k_tlb_t_conflict *tlb;
  int i;
  uint32_t tlb_mmid;
  _Bool mi;
  uint32_t MMID;
  uint16_t ASID;
  int access_type_local;
  int rw_local;
  target_ulong address_local;
  int *prot_local;
  hwaddr *physical_local;
  CPUMIPSState_conflict5 *env_local;
  
  local_78 = env->CP0_MemoryMapID;
  bVar5 = (env->CP0_Config5 >> 0x11 & 1U) == 0;
  if (bVar5) {
    local_78 = (uint)(ushort)((ushort)env->CP0_EntryHi & (ushort)env->CP0_EntryHi_ASID_mask);
  }
  tlb._4_4_ = 0;
  while( true ) {
    if (env->tlb->tlb_in_use <= tlb._4_4_) {
      return -2;
    }
    puVar3 = (ulong *)((long)&env->tlb->mmu + (long)(int)tlb._4_4_ * 0x28);
    uVar4 = (ulong)(uint)puVar3[1] | 0x1fff;
    if (bVar5) {
      local_7c = (uint)*(ushort *)((long)puVar3 + 0xc);
    }
    else {
      local_7c = (uint)puVar3[2];
    }
    if (((((*(ushort *)((long)puVar3 + 0x14) & 1) == 1) || (local_7c == local_78)) &&
        ((*puVar3 & (uVar4 ^ 0xffffffffffffffff)) ==
         (env->SEGMask & address & (uVar4 ^ 0xffffffffffffffff)))) &&
       (-1 < *(short *)((long)puVar3 + 0x14))) break;
    tlb._4_4_ = tlb._4_4_ + 1;
  }
  uVar2 = (uint)((address & uVar4 & (uVar4 >> 1 ^ 0xffffffffffffffff)) != 0);
  if (uVar2 == 0) {
    uVar1 = *(ushort *)((long)puVar3 + 0x14) >> 7;
  }
  else {
    uVar1 = *(ushort *)((long)puVar3 + 0x14) >> 8;
  }
  if ((uVar1 & 1) != 0) {
    if (rw == 2) {
      if (uVar2 == 0) {
        uVar1 = *(ushort *)((long)puVar3 + 0x14) >> 0xb;
      }
      else {
        uVar1 = *(ushort *)((long)puVar3 + 0x14) >> 0xc;
      }
      if ((uVar1 & 1) != 0) {
        return -6;
      }
    }
    if (rw == 0) {
      if (uVar2 == 0) {
        uVar1 = *(ushort *)((long)puVar3 + 0x14) >> 0xd;
      }
      else {
        uVar1 = *(ushort *)((long)puVar3 + 0x14) >> 0xe;
      }
      if ((uVar1 & 1) != 0) {
        return -5;
      }
    }
    if (rw == 1) {
      if (uVar2 == 0) {
        uVar1 = *(ushort *)((long)puVar3 + 0x14) >> 9;
      }
      else {
        uVar1 = *(ushort *)((long)puVar3 + 0x14) >> 10;
      }
      if ((uVar1 & 1) == 0) {
        return -4;
      }
    }
    *physical = puVar3[(long)(int)uVar2 + 3] | address & uVar4 >> 1;
    *prot = 1;
    if (uVar2 == 0) {
      uVar1 = *(ushort *)((long)puVar3 + 0x14) >> 9;
    }
    else {
      uVar1 = *(ushort *)((long)puVar3 + 0x14) >> 10;
    }
    if ((uVar1 & 1) != 0) {
      *prot = *prot | 2;
    }
    if (uVar2 == 0) {
      uVar1 = *(ushort *)((long)puVar3 + 0x14) >> 0xb;
    }
    else {
      uVar1 = *(ushort *)((long)puVar3 + 0x14) >> 0xc;
    }
    if ((uVar1 & 1) == 0) {
      *prot = *prot | 4;
    }
    return 0;
  }
  return -3;
}

Assistant:

int r4k_map_address(CPUMIPSState *env, hwaddr *physical, int *prot,
                    target_ulong address, int rw, int access_type)
{
    uint16_t ASID = env->CP0_EntryHi & env->CP0_EntryHi_ASID_mask;
    uint32_t MMID = env->CP0_MemoryMapID;
    bool mi = !!((env->CP0_Config5 >> CP0C5_MI) & 1);
    uint32_t tlb_mmid;
    int i;

    MMID = mi ? MMID : (uint32_t) ASID;

    for (i = 0; i < env->tlb->tlb_in_use; i++) {
        r4k_tlb_t *tlb = &env->tlb->mmu.r4k.tlb[i];
        /* 1k pages are not supported. */
        target_ulong mask = tlb->PageMask | ~(TARGET_PAGE_MASK << 1);
        target_ulong tag = address & ~mask;
        target_ulong VPN = tlb->VPN & ~mask;
#if defined(TARGET_MIPS64)
        tag &= env->SEGMask;
#endif

        /* Check ASID/MMID, virtual page number & size */
        tlb_mmid = mi ? tlb->MMID : (uint32_t) tlb->ASID;
        if ((tlb->G == 1 || tlb_mmid == MMID) && VPN == tag && !tlb->EHINV) {
            /* TLB match */
            int n = !!(address & mask & ~(mask >> 1));
            /* Check access rights */
            if (!(n ? tlb->V1 : tlb->V0)) {
                return TLBRET_INVALID;
            }
            if (rw == MMU_INST_FETCH && (n ? tlb->XI1 : tlb->XI0)) {
                return TLBRET_XI;
            }
            if (rw == MMU_DATA_LOAD && (n ? tlb->RI1 : tlb->RI0)) {
                return TLBRET_RI;
            }
            if (rw != MMU_DATA_STORE || (n ? tlb->D1 : tlb->D0)) {
                *physical = tlb->PFN[n] | (address & (mask >> 1));
                *prot = PAGE_READ;
                if (n ? tlb->D1 : tlb->D0) {
                    *prot |= PAGE_WRITE;
                }
                if (!(n ? tlb->XI1 : tlb->XI0)) {
                    *prot |= PAGE_EXEC;
                }
                return TLBRET_MATCH;
            }
            return TLBRET_DIRTY;
        }
    }
    return TLBRET_NOMATCH;
}